

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * Generate11SectorTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  bool bVar2;
  BitBuffer *bitstream;
  Sector *sector;
  pointer sector_00;
  BitstreamTrackBuilder bitbuf;
  
  bVar2 = Is11SectorTrack(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,MFM);
    TrackBuilder::addTrackStart(&bitbuf.super_TrackBuilder,true);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (sector_00 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_start; sector_00 != pSVar1;
        sector_00 = sector_00 + 1) {
      TrackBuilder::addSector(&bitbuf.super_TrackBuilder,sector_00,1);
    }
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return __return_storage_ptr__;
  }
  __assert_fail("Is11SectorTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x310,"TrackData Generate11SectorTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData Generate11SectorTrack(const CylHead& cylhead, const Track& track)
{
    assert(Is11SectorTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart(true);

    for (auto& sector : track)
        bitbuf.addSector(sector, 1);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}